

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_segmentation(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  int iVar1;
  int high;
  int iVar2;
  int iVar3;
  segmentation *dst;
  SEG_LVL_FEATURES feature_id;
  long in_RDI;
  int ubits;
  int data_min;
  int data_max;
  int feature_enabled;
  int data;
  int j;
  int i;
  segmentation *seg;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_20;
  int local_1c;
  
  dst = (segmentation *)(in_RDI + 19000);
  *(undefined1 *)(in_RDI + 0x4a39) = 0;
  *(undefined1 *)(in_RDI + 0x4a3a) = 0;
  *(undefined1 *)(in_RDI + 0x4a3b) = 0;
  iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  dst->enabled = (uint8_t)iVar1;
  if (dst->enabled == '\0') {
    if (*(long *)(*(long *)(in_RDI + 0xe8) + 0x50) != 0) {
      memset(*(void **)(*(long *)(in_RDI + 0xe8) + 0x50),0,
             (long)(*(int *)(*(long *)(in_RDI + 0xe8) + 0x104) *
                   *(int *)(*(long *)(in_RDI + 0xe8) + 0x108)));
    }
    memset(dst,0,0xac);
    segfeatures_copy((segmentation *)(*(long *)(in_RDI + 0xe8) + 0x58),dst);
  }
  else {
    if ((((*(char *)(in_RDI + 19000) == '\0') || (*(long *)(in_RDI + 0xe0) == 0)) ||
        (*(int *)(in_RDI + 0x214) != *(int *)(*(long *)(in_RDI + 0xe0) + 0x104))) ||
       (*(int *)(in_RDI + 0x218) != *(int *)(*(long *)(in_RDI + 0xe0) + 0x108))) {
      *(undefined8 *)(in_RDI + 0x4ae8) = 0;
    }
    else {
      *(undefined8 *)(in_RDI + 0x4ae8) = *(undefined8 *)(*(long *)(in_RDI + 0xe0) + 0x50);
    }
    if (*(int *)(in_RDI + 0x1fc) == 7) {
      *(undefined1 *)(in_RDI + 0x4a39) = 1;
      *(undefined1 *)(in_RDI + 0x4a3b) = 0;
      *(undefined1 *)(in_RDI + 0x4a3a) = 1;
    }
    else {
      iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      *(char *)(in_RDI + 0x4a39) = (char)iVar1;
      if (*(char *)(in_RDI + 0x4a39) == '\0') {
        *(undefined1 *)(in_RDI + 0x4a3b) = 0;
      }
      else {
        iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        *(char *)(in_RDI + 0x4a3b) = (char)iVar1;
      }
      iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      *(char *)(in_RDI + 0x4a3a) = (char)iVar1;
    }
    if (*(char *)(in_RDI + 0x4a3a) == '\0') {
      if (*(long *)(in_RDI + 0xe0) != 0) {
        segfeatures_copy(dst,(segmentation *)(*(long *)(in_RDI + 0xe0) + 0x58));
      }
    }
    else {
      av1_clearall_segfeatures((segmentation *)0x1cccfe);
      for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
        for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
          iVar1 = 0;
          in_stack_ffffffffffffffd8 =
               aom_rb_read_bit((aom_read_bit_buffer *)(ulong)in_stack_ffffffffffffffd8);
          feature_id = (SEG_LVL_FEATURES)local_20;
          if (in_stack_ffffffffffffffd8 != 0) {
            av1_enable_segfeature(dst,local_1c,feature_id);
            high = av1_seg_feature_data_max(feature_id);
            iVar1 = -high;
            iVar2 = get_unsigned_bits(0);
            iVar3 = av1_is_segfeature_signed(feature_id);
            if (iVar3 == 0) {
              iVar2 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(high,iVar1),iVar2);
            }
            else {
              iVar2 = aom_rb_read_inv_signed_literal
                                ((aom_read_bit_buffer *)CONCAT44(high,iVar1),iVar2);
            }
            iVar1 = clamp(iVar2,iVar1,high);
          }
          av1_set_segdata(dst,local_1c,feature_id,iVar1);
        }
      }
      av1_calculate_segdata(dst);
    }
    segfeatures_copy((segmentation *)(*(long *)(in_RDI + 0xe8) + 0x58),dst);
  }
  return;
}

Assistant:

static inline void setup_segmentation(AV1_COMMON *const cm,
                                      struct aom_read_bit_buffer *rb) {
  struct segmentation *const seg = &cm->seg;

  seg->update_map = 0;
  seg->update_data = 0;
  seg->temporal_update = 0;

  seg->enabled = aom_rb_read_bit(rb);
  if (!seg->enabled) {
    if (cm->cur_frame->seg_map) {
      memset(cm->cur_frame->seg_map, 0,
             (cm->cur_frame->mi_rows * cm->cur_frame->mi_cols));
    }

    memset(seg, 0, sizeof(*seg));
    segfeatures_copy(&cm->cur_frame->seg, seg);
    return;
  }
  if (cm->seg.enabled && cm->prev_frame &&
      (cm->mi_params.mi_rows == cm->prev_frame->mi_rows) &&
      (cm->mi_params.mi_cols == cm->prev_frame->mi_cols)) {
    cm->last_frame_seg_map = cm->prev_frame->seg_map;
  } else {
    cm->last_frame_seg_map = NULL;
  }
  // Read update flags
  if (cm->features.primary_ref_frame == PRIMARY_REF_NONE) {
    // These frames can't use previous frames, so must signal map + features
    seg->update_map = 1;
    seg->temporal_update = 0;
    seg->update_data = 1;
  } else {
    seg->update_map = aom_rb_read_bit(rb);
    if (seg->update_map) {
      seg->temporal_update = aom_rb_read_bit(rb);
    } else {
      seg->temporal_update = 0;
    }
    seg->update_data = aom_rb_read_bit(rb);
  }

  // Segmentation data update
  if (seg->update_data) {
    av1_clearall_segfeatures(seg);

    for (int i = 0; i < MAX_SEGMENTS; i++) {
      for (int j = 0; j < SEG_LVL_MAX; j++) {
        int data = 0;
        const int feature_enabled = aom_rb_read_bit(rb);
        if (feature_enabled) {
          av1_enable_segfeature(seg, i, j);

          const int data_max = av1_seg_feature_data_max(j);
          const int data_min = -data_max;
          const int ubits = get_unsigned_bits(data_max);

          if (av1_is_segfeature_signed(j)) {
            data = aom_rb_read_inv_signed_literal(rb, ubits);
          } else {
            data = aom_rb_read_literal(rb, ubits);
          }

          data = clamp(data, data_min, data_max);
        }
        av1_set_segdata(seg, i, j, data);
      }
    }
    av1_calculate_segdata(seg);
  } else if (cm->prev_frame) {
    segfeatures_copy(seg, &cm->prev_frame->seg);
  }
  segfeatures_copy(&cm->cur_frame->seg, seg);
}